

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O1

ParameterInfo * __thiscall
C3DFile::getParamInfo(ParameterInfo *__return_storage_ptr__,C3DFile *this,char *id_str)

{
  pointer pGVar1;
  pointer pGVar2;
  pointer pPVar3;
  char *pcVar4;
  ParameterInfo *pPVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  pointer info;
  bool bVar9;
  string group;
  string param;
  string id_string;
  char *local_b8;
  undefined8 local_b0;
  char local_a8;
  undefined7 uStack_a7;
  char *local_98;
  undefined8 local_90;
  char local_88;
  undefined7 uStack_87;
  ParameterInfo *local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,id_str,(allocator<char> *)&local_b8);
  lVar7 = std::__cxx11::string::find((char *)local_50,0x10c066,0);
  if (lVar7 == -1) {
    __assert_fail("id_string.find(\":\") != std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x19a,"ParameterInfo C3DFile::getParamInfo(const char *)");
  }
  local_b8 = &local_a8;
  local_b0 = 0;
  local_a8 = '\0';
  local_98 = &local_88;
  local_90 = 0;
  local_88 = '\0';
  std::__cxx11::string::find((char *)local_50,0x10c066,0);
  std::__cxx11::string::substr((ulong)local_70,(ulong)local_50);
  std::__cxx11::string::operator=((string *)&local_b8,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  std::__cxx11::string::find((char *)local_50,0x10c066,0);
  std::__cxx11::string::substr((ulong)local_70,(ulong)local_50);
  local_78 = __return_storage_ptr__;
  std::__cxx11::string::operator=((string *)&local_98,(string *)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  pcVar4 = local_b8;
  pGVar1 = (this->group_infos).super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar2 = (this->group_infos).super__Vector_base<GroupInfo,_std::allocator<GroupInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar8 = -1;
  bVar9 = pGVar1 == pGVar2;
  if (!bVar9) {
    iVar6 = strcmp(local_b8,pGVar1->name);
    while (iVar6 != 0) {
      bVar9 = pGVar1 + 1 == pGVar2;
      if (bVar9) goto LAB_0010786f;
      iVar6 = strcmp(pcVar4,pGVar1[1].name);
      pGVar1 = pGVar1 + 1;
    }
    iVar8 = (int)pGVar1->id;
  }
LAB_0010786f:
  pcVar4 = local_98;
  if (bVar9) {
    __assert_fail("group_iter != group_infos.end() && \"Could not find group!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x1b0,"ParameterInfo C3DFile::getParamInfo(const char *)");
  }
  info = (this->param_infos).super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (this->param_infos).super__Vector_base<ParameterInfo,_std::allocator<ParameterInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar9 = info == pPVar3;
  if (!bVar9) {
    do {
      iVar6 = strncmp(pcVar4,info->name,(long)info->name_length);
      pPVar5 = local_78;
      if ((iVar6 == 0) && ((int)info->group_id == -iVar8)) {
        if (!bVar9) {
          ParameterInfo::ParameterInfo(local_78,info);
          if (local_98 != &local_88) {
            operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          return pPVar5;
        }
        break;
      }
      info = info + 1;
      bVar9 = info == pPVar3;
    } while (!bVar9);
  }
  __assert_fail("param_iter != param_infos.end() && \"Could not find parameter with the specified group\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x1bc,"ParameterInfo C3DFile::getParamInfo(const char *)");
}

Assistant:

ParameterInfo C3DFile::getParamInfo (const char *id_str) {
	std::string id_string (id_str);
	assert (id_string.find(":") != std::string::npos);

	std::string group;
	std::string param;

	group = id_string.substr(0, id_string.find(":"));
	param = id_string.substr(id_string.find(":") + 1, id_string.length());

//	std::cout << "group = " << group << " param = " << param << std::endl;

	Sint8 group_id = -1;

	// search for the group id first as we need to find the parameter with the
	// given id
	std::vector<GroupInfo>::const_iterator group_iter = group_infos.begin();
	while (group_iter != group_infos.end()) {
		if (!strcmp(group.c_str(), group_iter->name)) {
			group_id = group_iter->id;
			break;
		}
		group_iter ++;
	}
	assert (group_iter != group_infos.end() && "Could not find group!");

	std::vector<ParameterInfo>::const_iterator param_iter = param_infos.begin();

	while (param_iter != param_infos.end()) {
		if (!strncmp(param.c_str(), param_iter->name, param_iter->name_length)
				&& param_iter->group_id == -group_id) {
			break;
		}
		param_iter++;
	}

	assert (param_iter != param_infos.end() && "Could not find parameter with the specified group");

	/*
	std::cout << "Group id = " << static_cast<int>(group_id)
		<< " param_iter->name = " << param_iter->name
		<< " param_iter->group_id = " << static_cast<int>(param_iter->group_id) << std::endl;
	*/
	
	return *param_iter;
}